

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O1

void libdef_lua(BuildCtx *ctx,char *p,int arg)

{
  anon_struct_16_2_62e3ee5c *paVar1;
  uint8_t *puVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  char *pcVar6;
  byte bVar7;
  uint uVar8;
  size_t sVar9;
  char **__s;
  char **ppcVar10;
  byte bVar11;
  anon_struct_16_2_62e3ee5c *paVar12;
  uint8_t *puVar13;
  long lVar14;
  uint8_t *puVar15;
  long lVar16;
  char *__s_00;
  double dVar17;
  char *pcStack_80;
  char *pcStack_78;
  char **ppcStack_70;
  char **ppcStack_68;
  char *pcStack_60;
  anon_struct_16_2_62e3ee5c *paStack_58;
  anon_struct_16_2_62e3ee5c *paStack_50;
  
  if (ctx->mode == BUILD_libdef) {
    puVar15 = (uint8_t *)p;
    iVar3 = strcmp("math_deg",p);
    lVar16 = 1;
    if (iVar3 == 0) {
      paVar12 = libbc_map;
    }
    else {
      paVar12 = libbc_map;
      do {
        if (lVar16 == 8) {
          libdef_lua_cold_1();
          paStack_58 = libbc_map;
          if (*(int *)(p + 8) != 8) {
            return;
          }
          paStack_50 = paVar12;
          if (recffid + 1 < ffid) {
            do {
              ppcStack_68 = (char **)0x10b163;
              fwrite(",\n0",3,1,*(FILE **)(p + 0x10));
              iVar3 = recffid + 2;
              recffid = recffid + 1;
            } while (iVar3 < ffid);
          }
          recffid = ffid;
          __s_00 = funcname;
          if (*puVar15 != '.') {
            __s_00 = (char *)puVar15;
          }
          __s = (char **)0x20;
          ppcStack_68 = (char **)0x10b1a1;
          pcVar6 = strchr(__s_00,0x20);
          if (pcVar6 == (char *)0x0) {
            pcStack_60 = (char *)0x0;
          }
          else {
            pcStack_60 = pcVar6 + 1;
            *pcVar6 = '\0';
          }
          if (obuf[0] == '\0') {
            puVar13 = obuf;
            uVar8 = 2;
            lVar16 = 0;
          }
          else {
            uVar8 = 2;
            puVar15 = obuf;
            lVar16 = 0;
            puVar13 = obuf;
            do {
              ppcStack_68 = (char **)0x10b1ec;
              __s = (char **)__s_00;
              iVar3 = strcmp((char *)puVar13,__s_00);
              if (iVar3 == 0) goto LAB_0010b23a;
              ppcStack_68 = (char **)0x10b1f8;
              sVar9 = strlen((char *)puVar13);
              lVar14 = lVar16 + sVar9;
              lVar16 = lVar14 + 1;
              uVar8 = uVar8 + 1;
              puVar13 = obuf + lVar14 + 1;
            } while (obuf[lVar14 + 1] != '\0');
          }
          ppcStack_68 = (char **)0x10b224;
          ppcVar10 = (char **)__s_00;
          sVar9 = strlen(__s_00);
          if ((long)(sVar9 + lVar16) < 0x1fff) {
            ppcStack_68 = (char **)0x10b23a;
            strcpy((char *)puVar13,__s_00);
LAB_0010b23a:
            if (pcStack_60 != (char *)0x0) {
              fprintf(*(FILE **)(p + 0x10),",\n0x%02x00+(%s)",(ulong)uVar8);
              return;
            }
            fprintf(*(FILE **)(p + 0x10),",\n0x%02x00",(ulong)uVar8);
            return;
          }
          ppcStack_68 = (char **)libdef_push;
          libdef_rec_cold_1();
          if (*(int *)(ppcVar10 + 1) != 7) {
            return;
          }
          pcVar6 = (char *)__s;
          pcStack_78 = p;
          ppcStack_70 = (char **)puVar15;
          ppcStack_68 = (char **)__s_00;
          sVar9 = strlen((char *)__s);
          iVar3 = (int)sVar9;
          if (*(char *)__s == '\"') {
            if ((1 < iVar3) && (*(char *)((long)__s + (ulong)(iVar3 - 1)) == '\"')) {
              *(undefined1 *)((long)__s + (ulong)(iVar3 - 1)) = 0;
              libdef_name((char *)((long)__s + 1),0xc0);
              return;
            }
            goto LAB_0010b3e0;
          }
          ppcVar10 = __s;
          if ((byte)(*(char *)__s - 0x30U) < 10) {
            pcVar6 = (char *)&pcStack_80;
            dVar17 = strtod((char *)__s,(char **)pcVar6);
            if (*pcStack_80 != '\0') goto LAB_0010b3e0;
            if (optr + 9 < (uint8_t *)((long)&optr + 1U)) {
              *optr = 0xfb;
              *(double *)(optr + 1) = dVar17;
              optr = optr + 9;
              return;
            }
LAB_0010b3e8:
            libdef_push_cold_3();
          }
          else {
            pcVar6 = "lastcl";
            iVar4 = strcmp((char *)__s,"lastcl");
            if (iVar4 == 0) {
              if (optr + 1 < (uint8_t *)((long)&optr + 1U)) {
                puVar15 = optr + 1;
                *optr = 0xfd;
                optr = puVar15;
                return;
              }
              goto LAB_0010b3f2;
            }
            if (iVar3 < 5) {
LAB_0010b3e0:
              libdef_push_cold_4();
              ppcVar10 = __s;
              goto LAB_0010b3e8;
            }
            pcVar6 = "top-";
            ppcVar10 = __s;
            iVar3 = strncmp((char *)__s,"top-",4);
            puVar15 = optr;
            if (iVar3 != 0) goto LAB_0010b3e0;
            puVar13 = optr + 2;
            if (puVar13 < (uint8_t *)((long)&optr + 1U)) {
              puVar2 = optr + 1;
              *optr = 0xfc;
              optr = puVar2;
              iVar3 = atoi((char *)((long)__s + 4));
              optr = puVar13;
              puVar15[1] = (uint8_t)iVar3;
              return;
            }
          }
          libdef_push_cold_1();
LAB_0010b3f2:
          libdef_push_cold_2();
          if (*(int *)(ppcVar10 + 1) == 7) {
            if ((*pcVar6 == '!') && (*(char *)((long)pcVar6 + 1) == '\0')) {
              *pcVar6 = 0;
            }
            libdef_name(pcVar6,0xc0);
            puVar15 = optr + 1;
            *optr = 0xfa;
            optr = puVar15;
            obuf[2] = obuf[2] + '\x01';
          }
          return;
        }
        paVar1 = paVar12 + 1;
        paVar12 = paVar12 + 1;
        puVar15 = (uint8_t *)p;
        iVar3 = strcmp(paVar1->name,p);
        lVar16 = lVar16 + 1;
      } while (iVar3 != 0);
    }
    iVar3 = paVar12->ofs;
    sVar9 = (long)libbc_map[lVar16].ofs - (long)iVar3;
    obuf[2] = obuf[2] + '\x01';
    puVar15 = optr + 1;
    *optr = 0xf9;
    optr = puVar15;
    libdef_name(p,0);
    puVar15 = optr;
    memcpy(optr,"" + iVar3,sVar9);
    bVar7 = puVar15[4];
    pbVar5 = puVar15 + 5;
    while ((char)bVar7 < '\0') {
      bVar7 = *pbVar5;
      pbVar5 = pbVar5 + 1;
    }
    bVar7 = *pbVar5;
    while (pbVar5 = pbVar5 + 1, (char)bVar7 < '\0') {
      bVar7 = *pbVar5;
    }
    bVar7 = *pbVar5;
    uVar8 = (uint)bVar7;
    pbVar5 = pbVar5 + 1;
    if ((char)bVar7 < '\0') {
      uVar8 = bVar7 & 0x7f;
      bVar7 = 7;
      do {
        bVar11 = *pbVar5;
        uVar8 = uVar8 | (bVar11 & 0x7f) << (bVar7 & 0x1f);
        pbVar5 = pbVar5 + 1;
        bVar7 = bVar7 + 7;
      } while ((char)bVar11 < '\0');
    }
    if (uVar8 != 0) {
      lVar16 = 0;
      do {
        bVar11 = pbVar5[lVar16 * 4 + 2];
        bVar7 = pbVar5[lVar16 * 4];
        if (pbVar5[lVar16 * 4 + 2] == 0xe && pbVar5[lVar16 * 4] == 0x10) {
          bVar11 = 0xf;
          bVar7 = 0x11;
        }
        pbVar5[lVar16 * 4] = bVar7;
        pbVar5[lVar16 * 4 + 2] = bVar11;
        lVar16 = lVar16 + 1;
      } while (uVar8 != (uint)lVar16);
    }
    optr = optr + sVar9;
  }
  return;
}

Assistant:

static void libdef_lua(BuildCtx *ctx, char *p, int arg)
{
  UNUSED(arg);
  if (ctx->mode == BUILD_libdef) {
    int i;
    for (i = 0; libbc_map[i].name != NULL; i++) {
      if (!strcmp(libbc_map[i].name, p)) {
	int ofs = libbc_map[i].ofs;
	int len = libbc_map[i+1].ofs - ofs;
	obuf[2]++;  /* Bump hash table size. */
	*optr++ = LIBINIT_LUA;
	libdef_name(p, 0);
	memcpy(optr, libbc_code + ofs, len);
	libdef_fixupbc(optr);
	optr += len;
	return;
      }
    }
    fprintf(stderr, "Error: missing libbc definition for %s\n", p);
    exit(1);
  }
}